

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::expand
          (DArray<DP::SimpleCongruenceClosure::ConstInfo> *this,size_t s)

{
  ConstInfo *__ptr;
  ulong uVar1;
  Literal *pLVar2;
  uint64_t uVar3;
  unsigned_long *puVar4;
  Literal *pLVar5;
  ulong in_RSI;
  ConstInfo *in_RDI;
  ConstInfo *newAddr;
  ConstInfo *oldAddr;
  ConstInfo *afterLast;
  ConstInfo *firstEmpty;
  ConstInfo *nptr;
  ConstInfo *optr;
  ConstInfo *oldArr;
  void *mem;
  size_t newCapacity;
  size_t oldCapacity;
  ConstInfo *in_stack_ffffffffffffff88;
  TermList *local_48;
  ConstInfo *this_00;
  unsigned_long local_28;
  unsigned_long local_20;
  uint64_t local_18;
  ulong local_10 [2];
  
  if ((in_RDI->term)._content < in_RSI) {
    local_18 = (in_RDI->term)._content;
    local_28 = local_18 << 1;
    local_10[0] = in_RSI;
    puVar4 = std::max<unsigned_long>(local_10,&local_28);
    local_20 = *puVar4;
    pLVar5 = (Literal *)Lib::alloc((size_t)in_RDI);
    __ptr = (ConstInfo *)in_RDI->lit;
    (in_RDI->term)._content = local_20;
    in_RDI->lit = pLVar5;
    local_48 = (TermList *)in_RDI->lit;
    pLVar5 = in_RDI->lit;
    uVar1 = *(ulong *)in_RDI;
    pLVar2 = in_RDI->lit;
    uVar3 = (in_RDI->term)._content;
    this_00 = __ptr;
    while ((Literal *)local_48 != (Literal *)((long)pLVar5 + uVar1 * 0xb8)) {
      this_00 = this_00 + 1;
      local_48 = local_48 + 0x17;
      DP::SimpleCongruenceClosure::ConstInfo::ConstInfo(in_RDI,in_stack_ffffffffffffff88);
      DP::SimpleCongruenceClosure::ConstInfo::~ConstInfo(in_RDI);
    }
    while ((Literal *)local_48 != (Literal *)((long)pLVar2 + uVar3 * 0xb8)) {
      memset(local_48,0,0xb8);
      DP::SimpleCongruenceClosure::ConstInfo::ConstInfo(this_00);
      local_48 = local_48 + 0x17;
    }
    in_RDI->sigSymbol = (undefined4)local_10[0];
    in_RDI->sigSymKind = local_10[0]._4_4_;
    if (__ptr != (ConstInfo *)0x0) {
      Lib::free(__ptr);
    }
  }
  else {
    in_RDI->sigSymbol = (int)in_RSI;
    in_RDI->sigSymKind = (int)(in_RSI >> 0x20);
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }